

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O3

ProString * __thiscall
VcprojGenerator::firstInputFileName
          (ProString *__return_storage_ptr__,VcprojGenerator *this,ProString *extraCompilerName)

{
  QMakeProject *this_00;
  QList<ProString> *this_01;
  iterator variableName;
  iterator iVar1;
  ProStringList *pPVar2;
  long in_FS_OFFSET;
  QStringBuilder<const_ProString_&,_const_char_(&)[7]> local_70;
  ProString local_60;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  local_70.b = (char (*) [7])0x2aa971;
  local_70.a = extraCompilerName;
  ProString::ProString<ProString_const&,char_const(&)[7]>(&local_60,&local_70);
  this_01 = &QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,(ProKey *)&local_60)->
             super_QList<ProString>;
  if (&(local_60.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_60.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_60.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  variableName = QList<ProString>::begin(this_01);
  iVar1 = QList<ProString>::end(this_01);
  do {
    if (variableName.i == iVar1.i) {
      ProString::ProString(__return_storage_ptr__);
LAB_0023e06c:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    pPVar2 = QMakeEvaluator::valuesRef
                       (&((this->super_Win32MakefileGenerator).super_MakefileGenerator.project)->
                         super_QMakeEvaluator,(ProKey *)variableName.i);
    if ((pPVar2->super_QList<ProString>).d.size != 0) {
      ProString::ProString(__return_storage_ptr__,(pPVar2->super_QList<ProString>).d.ptr);
      goto LAB_0023e06c;
    }
    variableName.i = variableName.i + 1;
  } while( true );
}

Assistant:

ProString VcprojGenerator::firstInputFileName(const ProString &extraCompilerName) const
{
    for (const ProString &var : project->values(ProKey(extraCompilerName + ".input"))) {
        const ProStringList &files = project->values(var.toKey());
        if (!files.isEmpty())
            return files.first();
    }
    return ProString();
}